

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void __thiscall
duckdb::StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>::
WriteVectorInternal<true>
          (StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
           *this,WriteStream *temp_writer,ColumnWriterStatistics *stats,
          ColumnWriterPageState *page_state_p,Vector *input_column,idx_t chunk_start,idx_t chunk_end
          )

{
  idx_t i;
  Allocator *pAVar1;
  long lVar2;
  idx_t iVar3;
  idx_t iVar4;
  primitive_dictionary_entry_t *ppVar5;
  InternalException *this_00;
  idx_t r;
  undefined8 uVar6;
  WriteStream *ser;
  StringStatisticsState *string_stats;
  Vector *pVVar7;
  ValidityMask *mask;
  string_t target_value;
  uint32_t value_index;
  anon_union_16_2_67f50693_for_value local_68;
  anon_union_16_2_67f50693_for_value local_58;
  undefined1 local_48 [16];
  StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator> *local_38;
  
  ser = (WriteStream *)chunk_start;
  local_38 = this;
  FlatVector::VerifyFlatVector(input_column);
  if (9 < *(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
switchD_00252c8c_caseD_1:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_58._0_8_ = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Unknown encoding","");
    duckdb::InternalException::InternalException(this_00,(string *)&local_58.pointer);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  pVVar7 = *(Vector **)(input_column + 0x20);
  mask = (ValidityMask *)(input_column + 0x28);
  switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    if (*(long *)mask == 0) {
      TemplatedWritePlain<duckdb::string_t,duckdb::string_t,duckdb::ParquetStringOperator,true>
                (pVVar7,stats,chunk_start,chunk_end,(ValidityMask *)temp_writer,ser);
      return;
    }
    TemplatedWritePlain<duckdb::string_t,duckdb::string_t,duckdb::ParquetStringOperator,false>
              (pVVar7,stats,chunk_start,chunk_end,mask,temp_writer);
    return;
  default:
    goto switchD_00252c8c_caseD_1;
  case 5:
    if ((chunk_start < chunk_end) &&
       (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0')) {
      iVar3 = chunk_start;
      do {
        iVar4 = chunk_start;
        if ((*(long *)mask == 0) ||
           (iVar4 = iVar3, (*(ulong *)(*(long *)mask + (iVar3 >> 6) * 8) >> (iVar3 & 0x3f) & 1) != 0
           )) {
          local_68._0_8_ = *(undefined8 *)(pVVar7 + iVar4 * 0x10);
          local_68.pointer.ptr = (char *)*(undefined8 *)(pVVar7 + iVar4 * 0x10 + 8);
          local_58._0_8_ = local_68._0_8_;
          local_58.pointer.ptr = local_68.pointer.ptr;
          StringStatisticsState::Update
                    ((StringStatisticsState *)stats,(string_t *)&local_58.pointer);
          DbpEncoder::BeginWrite<duckdb::string_t>
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(string_t *)&local_68.pointer);
          *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
          chunk_start = iVar4 + 1;
          goto LAB_00253039;
        }
        iVar3 = iVar3 + 1;
      } while (chunk_end != iVar3);
    }
    else {
LAB_00253039:
      lVar2 = chunk_end - chunk_start;
      if (chunk_start <= chunk_end && lVar2 != 0) {
        pVVar7 = pVVar7 + chunk_start * 0x10 + 8;
        do {
          local_68._0_8_ = *(undefined8 *)(pVVar7 + -8);
          local_68.pointer.ptr = (char *)*(undefined8 *)pVVar7;
          local_58._0_8_ = local_68._0_8_;
          local_58.pointer.ptr = local_68.pointer.ptr;
          StringStatisticsState::Update
                    ((StringStatisticsState *)stats,(string_t *)&local_58.pointer);
          DbpEncoder::WriteValue<duckdb::string_t>
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(string_t *)&local_68.pointer);
          pVVar7 = pVVar7 + 0x10;
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
      }
    }
    break;
  case 6:
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0')) {
      iVar3 = chunk_start;
      do {
        iVar4 = chunk_start;
        if ((*(long *)mask == 0) ||
           (iVar4 = iVar3, (*(ulong *)(*(long *)mask + (iVar3 >> 6) * 8) >> (iVar3 & 0x3f) & 1) != 0
           )) {
          local_68._0_8_ = *(undefined8 *)(pVVar7 + iVar4 * 0x10);
          local_68.pointer.ptr = (char *)*(undefined8 *)(pVVar7 + iVar4 * 0x10 + 8);
          local_58._0_8_ = local_68._0_8_;
          local_58.pointer.ptr = local_68.pointer.ptr;
          StringStatisticsState::Update
                    ((StringStatisticsState *)stats,(string_t *)&local_58.pointer);
          pAVar1 = (Allocator *)
                   duckdb::BufferAllocator::Get
                             (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                              context);
          DlbaEncoder::BeginWrite<duckdb::string_t>
                    ((DlbaEncoder *)(page_state_p + 0x909),pAVar1,temp_writer,
                     (string_t *)&local_68.pointer);
          *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
          chunk_start = iVar4 + 1;
          goto LAB_00252ed6;
        }
        iVar3 = iVar3 + 1;
      } while (chunk_end != iVar3);
    }
    else {
LAB_00252ed6:
      lVar2 = chunk_end - chunk_start;
      if (chunk_start <= chunk_end && lVar2 != 0) {
        pVVar7 = pVVar7 + chunk_start * 0x10 + 8;
        do {
          local_68._0_8_ = *(undefined8 *)(pVVar7 + -8);
          local_68.pointer.ptr = (char *)*(undefined8 *)pVVar7;
          local_58._0_8_ = local_68._0_8_;
          local_58.pointer.ptr = local_68.pointer.ptr;
          StringStatisticsState::Update
                    ((StringStatisticsState *)stats,(string_t *)&local_58.pointer);
          local_58._0_8_ = local_68._0_8_ & 0xffffffff;
          DbpEncoder::WriteValueInternal
                    ((DbpEncoder *)(page_state_p + 0x909),temp_writer,(int64_t *)&local_58);
          uVar6 = local_68.pointer.prefix;
          if (0xc < (local_68._0_8_ & 0xffffffff)) {
            uVar6 = local_68.pointer.ptr;
          }
          (**(code **)*page_state_p[0x1213]._vptr_ColumnWriterPageState)
                    (page_state_p[0x1213]._vptr_ColumnWriterPageState,uVar6);
          pVVar7 = pVVar7 + 0x10;
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
      }
    }
    break;
  case 8:
    iVar3 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0')) {
      iVar4 = chunk_start;
      do {
        iVar3 = chunk_start;
        if ((*(long *)mask == 0) ||
           (iVar3 = iVar4, (*(ulong *)(*(long *)mask + (iVar4 >> 6) * 8) >> (iVar4 & 0x3f) & 1) != 0
           )) {
          local_58.pointer.length._0_1_ =
               *(undefined1 *)((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4);
          (*(code *)**(undefined8 **)temp_writer)(temp_writer,&local_58,1);
          page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
          goto LAB_00252f9c;
        }
        iVar4 = iVar4 + 1;
      } while (chunk_end != iVar4);
    }
    else {
LAB_00252f9c:
      lVar2 = chunk_end - iVar3;
      if (iVar3 <= chunk_end && lVar2 != 0) {
        pVVar7 = pVVar7 + iVar3 * 0x10;
        do {
          ppVar5 = PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
                   ::Lookup((PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
                             *)page_state_p[0x121b]._vptr_ColumnWriterPageState,(string_t *)pVVar7);
          local_58.pointer.length = ppVar5->index;
          RleBpEncoder::WriteValue
                    ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)&local_58);
          pVVar7 = pVVar7 + 0x10;
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
      }
    }
    break;
  case 9:
    if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
      pAVar1 = (Allocator *)
               duckdb::BufferAllocator::Get
                         (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                          context);
      BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar1);
      *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
    }
    if (chunk_start < chunk_end) {
      do {
        local_68._0_8_ = *(undefined8 *)(pVVar7 + chunk_start * 0x10);
        local_68.pointer.ptr = (char *)*(undefined8 *)(pVVar7 + chunk_start * 0x10 + 8);
        local_58._0_8_ = local_68._0_8_;
        local_58.pointer.ptr = local_68.pointer.ptr;
        StringStatisticsState::Update((StringStatisticsState *)stats,(string_t *)&local_58.pointer);
        lVar2 = 0;
        do {
          *(undefined1 *)
           ((long)page_state_p[0x1217]._vptr_ColumnWriterPageState +
           (long)((long)page_state_p[0x1215]._vptr_ColumnWriterPageState * lVar2 +
                 (long)page_state_p[0x1219]._vptr_ColumnWriterPageState)) =
               *(undefined1 *)((long)&local_68 + lVar2);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x10);
        page_state_p[0x1217]._vptr_ColumnWriterPageState =
             (_func_int **)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + 1);
        chunk_start = chunk_start + 1;
      } while (chunk_start != chunk_end);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}